

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O3

void __thiscall re2::RE2::Init(RE2 *this,StringPiece *pattern,Options *options)

{
  const_pointer pcVar1;
  int64_t iVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined1 uVar10;
  bool bVar11;
  int iVar12;
  ParseFlags global_flags;
  Regexp *pRVar13;
  Prog *pPVar14;
  ostream *poVar15;
  string *psVar16;
  RegexpStatusCode RVar17;
  long *in_FS_OFFSET;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  RegexpStatus status;
  Regexp *suffix;
  RegexpStatus local_218;
  char *local_1f8;
  long local_1f0;
  char local_1e8 [16];
  string local_1d8;
  Regexp *local_1b8;
  size_type local_1b0;
  LogMessage local_1a8;
  
  local_1a8._0_8_ = &local_218;
  *in_FS_OFFSET = (long)&local_1a8;
  *in_FS_OFFSET =
       (long)std::once_flag::_Prepare_execution::
             _Prepare_execution<(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/mutex:775:25)>
             ::anon_class_1_0_00000001::__invoke;
  iVar12 = pthread_once(&Init::empty_once._M_once,__once_proxy);
  if (iVar12 != 0) {
    std::__throw_system_error(iVar12);
  }
  *in_FS_OFFSET = 0;
  *in_FS_OFFSET = 0;
  pcVar1 = pattern->data_;
  pcVar3 = &local_1a8.field_0x10;
  local_1a8._0_8_ = pcVar3;
  if (pcVar1 == (const_pointer)0x0) {
    local_1a8._8_8_ = 0;
    local_1a8._16_1_ = '\0';
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1a8,pcVar1,pcVar1 + pattern->size_);
  }
  std::__cxx11::string::operator=((string *)this,(string *)&local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar3) {
    operator_delete((void *)local_1a8._0_8_);
  }
  bVar11 = options->never_nl_;
  bVar4 = options->dot_nl_;
  bVar5 = options->never_capture_;
  bVar6 = options->case_sensitive_;
  bVar7 = options->perl_classes_;
  bVar8 = options->word_boundary_;
  bVar9 = options->one_line_;
  (this->options_).literal_ = options->literal_;
  (this->options_).never_nl_ = bVar11;
  (this->options_).dot_nl_ = bVar4;
  (this->options_).never_capture_ = bVar5;
  (this->options_).case_sensitive_ = bVar6;
  (this->options_).perl_classes_ = bVar7;
  (this->options_).word_boundary_ = bVar8;
  (this->options_).one_line_ = bVar9;
  bVar11 = options->posix_syntax_;
  bVar4 = options->longest_match_;
  bVar5 = options->log_errors_;
  uVar10 = options->field_0x7;
  iVar2 = options->max_mem_;
  (this->options_).encoding_ = options->encoding_;
  (this->options_).posix_syntax_ = bVar11;
  (this->options_).longest_match_ = bVar4;
  (this->options_).log_errors_ = bVar5;
  (this->options_).field_0x7 = uVar10;
  (this->options_).max_mem_ = iVar2;
  this->entire_regexp_ = (Regexp *)0x0;
  this->suffix_regexp_ = (Regexp *)0x0;
  this->prog_ = (Prog *)0x0;
  this->num_captures_ = -1;
  this->rprog_ = (Prog *)0x0;
  this->error_ = empty_string_abi_cxx11_;
  this->error_code_ = NoError;
  this->named_groups_ =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        *)0x0;
  this->group_names_ =
       (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)0x0;
  local_218.code_ = kRegexpSuccess;
  local_218.error_arg_.data_ = (const_pointer)0x0;
  local_218.error_arg_.size_ = 0;
  local_218.tmp_ = (string *)0x0;
  local_1a8._0_8_ = (this->pattern_)._M_dataplus._M_p;
  local_1a8._8_8_ = (this->pattern_)._M_string_length;
  global_flags = Options::ParseFlags(&this->options_);
  pRVar13 = Regexp::Parse((StringPiece *)&local_1a8,global_flags,&local_218);
  this->entire_regexp_ = pRVar13;
  if (pRVar13 == (Regexp *)0x0) {
    if ((this->options_).log_errors_ == true) {
      LogMessage::LogMessage
                (&local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/re2.cc"
                 ,0xc2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)((long)&local_1a8 + 8U),"Error parsing \'",0xf);
      local_1b8 = (Regexp *)(this->pattern_)._M_dataplus._M_p;
      local_1b0 = (this->pattern_)._M_string_length;
      trunc_abi_cxx11_((re2 *)&local_1f8,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)((long)&local_1a8 + 8U),local_1f8,local_1f0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\': ",3);
      RegexpStatus::Text_abi_cxx11_(&local_1d8,&local_218);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar15,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      if (local_1f8 != local_1e8) {
        operator_delete(local_1f8);
      }
      LogMessage::~LogMessage(&local_1a8);
    }
    psVar16 = (string *)operator_new(0x20);
    RegexpStatus::Text_abi_cxx11_(psVar16,&local_218);
    this->error_ = psVar16;
    RVar17 = kRegexpInternalError;
    if (local_218.code_ < (kRegexpBadUTF8|kRegexpBadEscape)) {
      RVar17 = local_218.code_;
    }
    this->error_code_ = RVar17;
    if (local_218.error_arg_.data_ == (const_pointer)0x0) {
      local_1a8._8_8_ = 0;
      local_1a8._16_1_ = '\0';
      local_1a8._0_8_ = pcVar3;
    }
    else {
      local_1a8._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1a8,local_218.error_arg_.data_,
                 local_218.error_arg_.data_ + local_218.error_arg_.size_);
    }
    std::__cxx11::string::operator=((string *)&this->error_arg_,(string *)&local_1a8);
    if ((pointer)local_1a8._0_8_ != pcVar3) {
      operator_delete((void *)local_1a8._0_8_);
    }
  }
  else {
    bVar11 = Regexp::RequiredPrefix(pRVar13,&this->prefix_,&this->prefix_foldcase_,&local_1b8);
    pRVar13 = local_1b8;
    if (!bVar11) {
      pRVar13 = Regexp::Incref(this->entire_regexp_);
    }
    this->suffix_regexp_ = pRVar13;
    pPVar14 = Regexp::CompileToProg(pRVar13,((this->options_).max_mem_ * 2) / 3);
    this->prog_ = pPVar14;
    if (pPVar14 == (Prog *)0x0) {
      if ((this->options_).log_errors_ == true) {
        LogMessage::LogMessage
                  (&local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/re2.cc"
                   ,0xd7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)((long)&local_1a8 + 8U),"Error compiling \'",0x11);
        local_1d8._M_dataplus._M_p = (this->pattern_)._M_dataplus._M_p;
        local_1d8._M_string_length = (this->pattern_)._M_string_length;
        trunc_abi_cxx11_((re2 *)&local_1f8,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00)
                        );
        poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)((long)&local_1a8 + 8U),local_1f8,local_1f0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\'",1);
        if (local_1f8 != local_1e8) {
          operator_delete(local_1f8);
        }
        LogMessage::~LogMessage(&local_1a8);
      }
      psVar16 = (string *)operator_new(0x20);
      (psVar16->_M_dataplus)._M_p = (pointer)&psVar16->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)psVar16,"pattern too large - compile failed","");
      this->error_ = psVar16;
      this->error_code_ = ErrorPatternTooLarge;
    }
    else {
      iVar12 = Regexp::NumCaptures(this->suffix_regexp_);
      this->num_captures_ = iVar12;
      bVar11 = Prog::IsOnePass(this->prog_);
      this->is_one_pass_ = bVar11;
    }
  }
  RegexpStatus::~RegexpStatus(&local_218);
  return;
}

Assistant:

void RE2::Init(const StringPiece& pattern, const Options& options) {
  static std::once_flag empty_once;
  std::call_once(empty_once, []() {
    empty_string = new std::string;
    empty_named_groups = new std::map<std::string, int>;
    empty_group_names = new std::map<int, std::string>;
  });

  pattern_ = std::string(pattern);
  options_.Copy(options);
  entire_regexp_ = NULL;
  suffix_regexp_ = NULL;
  prog_ = NULL;
  num_captures_ = -1;
  rprog_ = NULL;
  error_ = empty_string;
  error_code_ = NoError;
  named_groups_ = NULL;
  group_names_ = NULL;

  RegexpStatus status;
  entire_regexp_ = Regexp::Parse(
    pattern_,
    static_cast<Regexp::ParseFlags>(options_.ParseFlags()),
    &status);
  if (entire_regexp_ == NULL) {
    if (options_.log_errors()) {
      LOG(ERROR) << "Error parsing '" << trunc(pattern_) << "': "
                 << status.Text();
    }
    error_ = new std::string(status.Text());
    error_code_ = RegexpErrorToRE2(status.code());
    error_arg_ = std::string(status.error_arg());
    return;
  }

  re2::Regexp* suffix;
  if (entire_regexp_->RequiredPrefix(&prefix_, &prefix_foldcase_, &suffix))
    suffix_regexp_ = suffix;
  else
    suffix_regexp_ = entire_regexp_->Incref();

  // Two thirds of the memory goes to the forward Prog,
  // one third to the reverse prog, because the forward
  // Prog has two DFAs but the reverse prog has one.
  prog_ = suffix_regexp_->CompileToProg(options_.max_mem()*2/3);
  if (prog_ == NULL) {
    if (options_.log_errors())
      LOG(ERROR) << "Error compiling '" << trunc(pattern_) << "'";
    error_ = new std::string("pattern too large - compile failed");
    error_code_ = RE2::ErrorPatternTooLarge;
    return;
  }

  // We used to compute this lazily, but it's used during the
  // typical control flow for a match call, so we now compute
  // it eagerly, which avoids the overhead of std::once_flag.
  num_captures_ = suffix_regexp_->NumCaptures();

  // Could delay this until the first match call that
  // cares about submatch information, but the one-pass
  // machine's memory gets cut from the DFA memory budget,
  // and that is harder to do if the DFA has already
  // been built.
  is_one_pass_ = prog_->IsOnePass();
}